

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

bool CallMetaFunction(lua_State *L,int valueIndex,char *method,int numResults,int *result)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = (*lua_getmetatable)(L,valueIndex);
  if (iVar1 == 0) {
    bVar3 = false;
  }
  else {
    iVar1 = (*lua_gettop)(L);
    iVar2 = (*lua_type)(L,iVar1);
    bVar3 = true;
    if (iVar2 != 0) {
      (*lua_pushstring)(L,method);
      (*lua_rawget)(L,iVar1);
      iVar2 = (*lua_type)(L,-1);
      if (iVar2 == 0) {
        (*lua_settop)(L,-2);
        bVar3 = false;
      }
      else {
        (*lua_pushvalue)(L,valueIndex);
        iVar2 = lua_pcall(L,1,numResults,0);
        *result = iVar2;
      }
    }
    lua_remove(L,iVar1);
  }
  return bVar3;
}

Assistant:

bool CallMetaFunction(lua_State *L, int valueIndex, const char *method, int numResults, int &result) {
	if (lua_getmetatable(L, valueIndex)) {
		const int metaIndex = lua_gettop(L);
		if (!lua_isnil(L, metaIndex)) {
			lua_pushstring(L, method);
			lua_rawget(L, metaIndex);
			if (lua_isnil(L, -1)) {
				// The meta-method doesn't exist.
				lua_pop(L, 1);
				lua_remove(L, metaIndex);
				return false;
			}
			lua_pushvalue(L, valueIndex);
			result = lua_pcall(L, 1, numResults, 0);
		}
		lua_remove(L, metaIndex);
		return true;
	}
	return false;
}